

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  string *psVar2;
  allocator<char> local_b9;
  salsa_file_wrapper sfw;
  string out_file_name;
  string in_file_name;
  string key;
  string local_50;
  
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  in_file_name._M_dataplus._M_p = (pointer)&in_file_name.field_2;
  in_file_name._M_string_length = 0;
  out_file_name._M_dataplus._M_p = (pointer)&out_file_name.field_2;
  out_file_name._M_string_length = 0;
  in_file_name.field_2._M_local_buf[0] = '\0';
  out_file_name.field_2._M_local_buf[0] = '\0';
switchD_0010244d_caseD_6a:
  iVar1 = getopt(argc,argv,"i:o:k:vh");
  psVar2 = &out_file_name;
  switch(iVar1) {
  case 0x68:
    goto switchD_0010244d_caseD_68;
  case 0x69:
    psVar2 = &in_file_name;
    break;
  case 0x6a:
  case 0x6c:
  case 0x6d:
  case 0x6e:
    goto switchD_0010244d_caseD_6a;
  case 0x6b:
    psVar2 = &key;
    break;
  case 0x6f:
    break;
  default:
    if (iVar1 != -1) goto code_r0x0010246b;
    if (((key._M_string_length == 0) || (in_file_name._M_string_length == 0)) ||
       (out_file_name._M_string_length == 0)) {
      print_help();
    }
    else {
      salsa_file_wrapper::salsa_file_wrapper(&sfw);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"99990001",&local_b9);
      salsa_file_wrapper::set_key_and_nonce(&sfw,&key,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      salsa_file_wrapper::crypt_file(&sfw,&in_file_name,&out_file_name,true);
      salsa_file_wrapper::~salsa_file_wrapper(&sfw);
    }
    goto LAB_00102475;
  }
  std::__cxx11::string::assign((char *)psVar2);
  goto switchD_0010244d_caseD_6a;
code_r0x0010246b:
  if (iVar1 == 0x76) {
switchD_0010244d_caseD_68:
    print_help();
LAB_00102475:
    std::__cxx11::string::~string((string *)&out_file_name);
    std::__cxx11::string::~string((string *)&in_file_name);
    std::__cxx11::string::~string((string *)&key);
    return 0;
  }
  goto switchD_0010244d_caseD_6a;
}

Assistant:

int main(int argc, char **argv)
{
    (void)argc;
    (void)argv;

    std::string key;

    std::string in_file_name;
    std::string out_file_name;

    int c = 0;
    while ((c = getopt(argc, argv, "i:o:k:vh")) != -1)
    {
        switch (c)
        {
        case 'i': in_file_name = optarg;
            break;
        case 'o': out_file_name = optarg;
            break;
        case 'k': key = optarg;
            break;
        case 'v':
        case 'h':
            print_help();
            return 0;
        }
    }

    bool strings_is_ready = true;
    strings_is_ready &= !key.empty();
    strings_is_ready &= !in_file_name.empty();
    strings_is_ready &= !out_file_name.empty();

    if (strings_is_ready)
    {
        salsa_file_wrapper sfw;
        sfw.set_key_and_nonce(key, c_nonce);
        sfw.crypt_file(in_file_name, out_file_name, true);
    }
    else
    {
        print_help();
    }

    return 0;
}